

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_reader_utils.c
# Opt level: O0

void ShiftBytes(VP8LBitReader *br)

{
  int iVar1;
  VP8LBitReader *in_RDI;
  bool bVar2;
  
  while( true ) {
    bVar2 = false;
    if (7 < in_RDI->bit_pos_) {
      bVar2 = in_RDI->pos_ < in_RDI->len_;
    }
    if (!bVar2) break;
    in_RDI->val_ = in_RDI->val_ >> 8;
    in_RDI->val_ = (ulong)in_RDI->buf_[in_RDI->pos_] << 0x38 | in_RDI->val_;
    in_RDI->pos_ = in_RDI->pos_ + 1;
    in_RDI->bit_pos_ = in_RDI->bit_pos_ + -8;
  }
  iVar1 = VP8LIsEndOfStream(in_RDI);
  if (iVar1 != 0) {
    VP8LSetEndOfStream(in_RDI);
  }
  return;
}

Assistant:

static void ShiftBytes(VP8LBitReader* const br) {
  while (br->bit_pos_ >= 8 && br->pos_ < br->len_) {
    br->val_ >>= 8;
    br->val_ |= ((vp8l_val_t)br->buf_[br->pos_]) << (VP8L_LBITS - 8);
    ++br->pos_;
    br->bit_pos_ -= 8;
  }
  if (VP8LIsEndOfStream(br)) {
    VP8LSetEndOfStream(br);
  }
}